

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

TEdge * __thiscall
ClipperLib::ClipperBase::ProcessBound(ClipperBase *this,TEdge *E,bool NextIsForward)

{
  pointer *ppLVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  cInt cVar4;
  TEdge *pTVar5;
  TEdge *pTVar6;
  TEdge **ppTVar7;
  TEdge *pTVar8;
  value_type locMin;
  LocalMinimum local_28;
  
  if (E->OutIdx == -2) {
    pTVar5 = E;
    if (NextIsForward) {
      do {
        pTVar6 = pTVar5;
        pTVar5 = pTVar6->Next;
      } while ((pTVar6->Top).Y == (pTVar6->Next->Bot).Y);
      for (; ((pTVar6 != E && (pTVar6->Dx == -1e+40)) && (!NAN(pTVar6->Dx))); pTVar6 = pTVar6->Prev)
      {
      }
    }
    else {
      do {
        pTVar6 = pTVar5;
        pTVar5 = pTVar6->Prev;
      } while ((pTVar6->Top).Y == (pTVar6->Prev->Bot).Y);
      for (; ((pTVar6 != E && (pTVar6->Dx == -1e+40)) && (!NAN(pTVar6->Dx))); pTVar6 = pTVar6->Next)
      {
      }
    }
    if (pTVar6 != E) {
      local_28.RightBound = (&E->Next)[!NextIsForward];
      local_28.Y = ((local_28.RightBound)->Bot).Y;
      local_28.LeftBound = (TEdge *)0x0;
      (local_28.RightBound)->WindDelta = 0;
      pTVar5 = ProcessBound(this,local_28.RightBound,NextIsForward);
      __position._M_current =
           (this->m_MinimaList).
           super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->m_MinimaList).
          super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        (__position._M_current)->RightBound = local_28.RightBound;
        (__position._M_current)->Y = local_28.Y;
        (__position._M_current)->LeftBound = local_28.LeftBound;
        ppLVar1 = &(this->m_MinimaList).
                   super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
        return pTVar5;
      }
      std::vector<ClipperLib::LocalMinimum,std::allocator<ClipperLib::LocalMinimum>>::
      _M_realloc_insert<ClipperLib::LocalMinimum_const&>
                ((vector<ClipperLib::LocalMinimum,std::allocator<ClipperLib::LocalMinimum>> *)
                 &this->m_MinimaList,__position,&local_28);
      return pTVar5;
    }
    if (NextIsForward) {
      return pTVar6->Next;
    }
    return pTVar6->Prev;
  }
  if ((E->Dx == -1e+40) && (!NAN(E->Dx))) {
    pTVar5 = (&E->Next)[NextIsForward];
    lVar2 = (pTVar5->Bot).X;
    lVar3 = (E->Bot).X;
    if ((pTVar5->Dx == -1e+40) && (!NAN(pTVar5->Dx))) {
      if (lVar2 == lVar3) goto LAB_0010e572;
      lVar2 = (pTVar5->Top).X;
    }
    if (lVar2 != lVar3) {
      cVar4 = (E->Top).X;
      (E->Top).X = lVar3;
      (E->Bot).X = cVar4;
    }
  }
LAB_0010e572:
  pTVar5 = E;
  if (NextIsForward) {
    do {
      pTVar6 = pTVar5;
      pTVar5 = pTVar6->Next;
      if ((pTVar6->Top).Y != (pTVar5->Bot).Y) break;
    } while (pTVar5->OutIdx != -2);
    if (((pTVar6->Dx == -1e+40) && (!NAN(pTVar6->Dx))) && (pTVar8 = pTVar6, pTVar5->OutIdx != -2)) {
      do {
        pTVar8 = pTVar8->Prev;
      } while (pTVar8->Dx == -1e+40);
      if ((pTVar5->Top).X < (pTVar8->Top).X) {
        pTVar6 = pTVar8;
      }
    }
    pTVar5 = E;
    pTVar8 = E;
    if (pTVar6 != E) {
      do {
        pTVar5 = pTVar8->Next;
        pTVar8->NextInLML = pTVar5;
        if (((pTVar8 != E) && (pTVar8->Dx == -1e+40)) &&
           ((!NAN(pTVar8->Dx) && (lVar3 = (pTVar8->Bot).X, lVar3 != (pTVar8->Prev->Top).X)))) {
          cVar4 = (pTVar8->Top).X;
          (pTVar8->Top).X = lVar3;
          (pTVar8->Bot).X = cVar4;
        }
        pTVar8 = pTVar5;
      } while (pTVar5 != pTVar6);
    }
    if (((pTVar5 != E) && (pTVar5->Dx == -1e+40)) &&
       ((!NAN(pTVar5->Dx) && (lVar3 = (pTVar5->Bot).X, lVar3 != (pTVar5->Prev->Top).X)))) {
      cVar4 = (pTVar5->Top).X;
      (pTVar5->Top).X = lVar3;
      (pTVar5->Bot).X = cVar4;
    }
    ppTVar7 = &pTVar6->Next;
  }
  else {
    do {
      pTVar6 = pTVar5;
      pTVar5 = pTVar6->Prev;
      if ((pTVar6->Top).Y != (pTVar5->Bot).Y) break;
    } while (pTVar5->OutIdx != -2);
    if (((pTVar6->Dx == -1e+40) && (!NAN(pTVar6->Dx))) && (pTVar8 = pTVar6, pTVar5->OutIdx != -2)) {
      do {
        pTVar8 = pTVar8->Next;
      } while (pTVar8->Dx == -1e+40);
      if ((pTVar5->Top).X <= (pTVar8->Top).X) {
        pTVar6 = pTVar8;
      }
    }
    pTVar5 = E;
    pTVar8 = E;
    if (pTVar6 != E) {
      do {
        pTVar5 = pTVar8->Prev;
        pTVar8->NextInLML = pTVar5;
        if (((pTVar8 != E) && (pTVar8->Dx == -1e+40)) &&
           ((!NAN(pTVar8->Dx) && (lVar3 = (pTVar8->Bot).X, lVar3 != (pTVar8->Next->Top).X)))) {
          cVar4 = (pTVar8->Top).X;
          (pTVar8->Top).X = lVar3;
          (pTVar8->Bot).X = cVar4;
        }
        pTVar8 = pTVar5;
      } while (pTVar5 != pTVar6);
    }
    if (((pTVar5 != E) && (pTVar5->Dx == -1e+40)) &&
       ((!NAN(pTVar5->Dx) && (lVar3 = (pTVar5->Bot).X, lVar3 != (pTVar5->Next->Top).X)))) {
      cVar4 = (pTVar5->Top).X;
      (pTVar5->Top).X = lVar3;
      (pTVar5->Bot).X = cVar4;
    }
    ppTVar7 = &pTVar6->Prev;
  }
  return *ppTVar7;
}

Assistant:

TEdge* ClipperBase::ProcessBound(TEdge* E, bool NextIsForward)
{
  TEdge *Result = E;
  TEdge *Horz = 0;

  if (E->OutIdx == Skip)
  {
    //if edges still remain in the current bound beyond the skip edge then
    //create another LocMin and call ProcessBound once more
    if (NextIsForward)
    {
      while (E->Top.Y == E->Next->Bot.Y) E = E->Next;
      //don't include top horizontals when parsing a bound a second time,
      //they will be contained in the opposite bound ...
      while (E != Result && IsHorizontal(*E)) E = E->Prev;
    }
    else
    {
      while (E->Top.Y == E->Prev->Bot.Y) E = E->Prev;
      while (E != Result && IsHorizontal(*E)) E = E->Next;
    }

    if (E == Result)
    {
      if (NextIsForward) Result = E->Next;
      else Result = E->Prev;
    }
    else
    {
      //there are more edges in the bound beyond result starting with E
      if (NextIsForward)
        E = Result->Next;
      else
        E = Result->Prev;
      MinimaList::value_type locMin;
      locMin.Y = E->Bot.Y;
      locMin.LeftBound = 0;
      locMin.RightBound = E;
      E->WindDelta = 0;
      Result = ProcessBound(E, NextIsForward);
      m_MinimaList.push_back(locMin);
    }
    return Result;
  }

  TEdge *EStart;

  if (IsHorizontal(*E))
  {
    //We need to be careful with open paths because this may not be a
    //true local minima (ie E may be following a skip edge).
    //Also, consecutive horz. edges may start heading left before going right.
    if (NextIsForward) 
      EStart = E->Prev;
    else 
      EStart = E->Next;
    if (IsHorizontal(*EStart)) //ie an adjoining horizontal skip edge
      {
        if (EStart->Bot.X != E->Bot.X && EStart->Top.X != E->Bot.X)
          ReverseHorizontal(*E);
      }
      else if (EStart->Bot.X != E->Bot.X)
        ReverseHorizontal(*E);
  }
  
  EStart = E;
  if (NextIsForward)
  {
    while (Result->Top.Y == Result->Next->Bot.Y && Result->Next->OutIdx != Skip)
      Result = Result->Next;
    if (IsHorizontal(*Result) && Result->Next->OutIdx != Skip)
    {
      //nb: at the top of a bound, horizontals are added to the bound
      //only when the preceding edge attaches to the horizontal's left vertex
      //unless a Skip edge is encountered when that becomes the top divide
      Horz = Result;
      while (IsHorizontal(*Horz->Prev)) Horz = Horz->Prev;
      if (Horz->Prev->Top.X > Result->Next->Top.X) Result = Horz->Prev;
    }
    while (E != Result) 
    {
      E->NextInLML = E->Next;
      if (IsHorizontal(*E) && E != EStart &&
        E->Bot.X != E->Prev->Top.X) ReverseHorizontal(*E);
      E = E->Next;
    }
    if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Prev->Top.X) 
      ReverseHorizontal(*E);
    Result = Result->Next; //move to the edge just beyond current bound
  } else
  {
    while (Result->Top.Y == Result->Prev->Bot.Y && Result->Prev->OutIdx != Skip) 
      Result = Result->Prev;
    if (IsHorizontal(*Result) && Result->Prev->OutIdx != Skip)
    {
      Horz = Result;
      while (IsHorizontal(*Horz->Next)) Horz = Horz->Next;
      if (Horz->Next->Top.X == Result->Prev->Top.X ||
          Horz->Next->Top.X > Result->Prev->Top.X) Result = Horz->Next;
    }

    while (E != Result)
    {
      E->NextInLML = E->Prev;
      if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Next->Top.X) 
        ReverseHorizontal(*E);
      E = E->Prev;
    }
    if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Next->Top.X) 
      ReverseHorizontal(*E);
    Result = Result->Prev; //move to the edge just beyond current bound
  }

  return Result;
}